

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O0

int Abc_NodeMffcLabel(Abc_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  int Count2;
  int Count1;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_NodeDeref_rec(pNode);
  Abc_NtkIncrementTravId(pNode->pNtk);
  Abc_NodeMffcLabel_rec(pNode,1);
  iVar2 = Abc_NodeRef_rec(pNode);
  if (iVar1 == iVar2) {
    return iVar1;
  }
  __assert_fail("Count1 == Count2",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcRefs.c"
                ,0x1bf,"int Abc_NodeMffcLabel(Abc_Obj_t *)");
}

Assistant:

int Abc_NodeMffcLabel( Abc_Obj_t * pNode )
{
    int Count1, Count2;
    // dereference the node
    Count1 = Abc_NodeDeref_rec( pNode );
    // collect the nodes inside the MFFC
    Abc_NtkIncrementTravId( pNode->pNtk );
    Abc_NodeMffcLabel_rec( pNode, 1 );
    // reference it back
    Count2 = Abc_NodeRef_rec( pNode );
    assert( Count1 == Count2 );
    return Count1;
}